

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O2

void __thiscall TreeDecomposition::buildFromFile(TreeDecomposition *this)

{
  vector<TDNode_*,_std::allocator<TDNode_*>_> *this_00;
  mapped_type mVar1;
  pointer ppTVar2;
  pointer puVar3;
  pointer puVar4;
  TDNode *node;
  mapped_type mVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  istream *piVar9;
  unsigned_long uVar10;
  unsigned_long __new_size;
  unsigned_long uVar11;
  unsigned_long uVar12;
  Attribute *this_01;
  mapped_type *pmVar13;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_02;
  TDNode *pTVar14;
  bitset<100UL> *__s;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Type t;
  size_t n_1;
  long lVar18;
  size_t sVar19;
  size_t n;
  unsigned_long uVar20;
  bitset<100UL> schema;
  string line;
  string name;
  var_bitset rootSchemaBitset;
  string index;
  string attrs;
  _Base_bitset<2UL> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string node2;
  string node1;
  string eString;
  string mString;
  string nString;
  string type;
  string attribute;
  stringstream ssLine;
  ostream local_3f0 [376];
  string local_278;
  string local_258;
  ifstream input;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&input,(string *)multifaq::config::TREEDECOMP_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(_input + -0x18)] & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::config::TREEDECOMP_CONF_abi_cxx11_," does not exist. \n");
    std::operator<<((ostream *)&std::cerr,(string *)&ssLine);
    std::__cxx11::string::~string((string *)&ssLine);
    exit(1);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ssLine);
  attribute._M_dataplus._M_p = (pointer)&attribute.field_2;
  attribute._M_string_length = 0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  attribute.field_2._M_local_buf[0] = '\0';
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  attrs._M_dataplus._M_p = (pointer)&attrs.field_2;
  attrs._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  type.field_2._M_local_buf[0] = '\0';
  attrs.field_2._M_local_buf[0] = '\0';
  index._M_dataplus._M_p = (pointer)&index.field_2;
  index._M_string_length = 0;
  index.field_2._M_local_buf[0] = '\0';
  do {
    do {
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input,(string *)&line);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) goto LAB_001dfae5;
    } while (*line._M_dataplus._M_p == '#');
    bVar6 = std::operator==(&line,"");
  } while (bVar6);
LAB_001dfae5:
  std::operator<<(local_3f0,(string *)&line);
  nString._M_dataplus._M_p = (pointer)&nString.field_2;
  nString._M_string_length = 0;
  mString._M_dataplus._M_p = (pointer)&mString.field_2;
  mString._M_string_length = 0;
  nString.field_2._M_local_buf[0] = '\0';
  mString.field_2._M_local_buf[0] = '\0';
  eString._M_dataplus._M_p = (pointer)&eString.field_2;
  eString._M_string_length = 0;
  eString.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&ssLine,(string *)&nString,' ');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&ssLine,(string *)&mString,' ');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&ssLine,(string *)&eString,' ');
  std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
  uVar10 = std::__cxx11::stoul(&nString,(size_t *)0x0,10);
  __new_size = std::__cxx11::stoul(&mString,(size_t *)0x0,10);
  uVar11 = std::__cxx11::stoul(&eString,(size_t *)0x0,10);
  this->_numOfAttributes = uVar10;
  this->_numOfRelations = __new_size;
  this->_numOfEdges = uVar11;
  this_00 = &this->_relations;
  std::vector<TDNode_*,_std::allocator<TDNode_*>_>::resize(this_00,__new_size);
  std::vector<Attribute_*,_std::allocator<Attribute_*>_>::resize(&this->_attributes,uVar10);
  uVar20 = 0;
  do {
    if (uVar20 == uVar10) {
      this_02 = &this->_relationsMap;
      sVar19 = 0;
      do {
        if (sVar19 == __new_size) {
          node1._M_dataplus._M_p = (pointer)&node1.field_2;
          node1._M_string_length = 0;
          uVar10 = 0;
          node1.field_2._M_local_buf[0] = '\0';
          node2._M_dataplus._M_p = (pointer)&node2.field_2;
          node2._M_string_length = 0;
          node2.field_2._M_local_buf[0] = '\0';
          do {
            if (uVar10 == uVar11) {
              uVar16 = 0;
              do {
                ppTVar2 = (this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (this->_numOfRelations <= uVar16) {
                  pTVar14 = *ppTVar2;
                  this->_root = pTVar14;
                  rootSchemaBitset.super__Base_bitset<2UL>._M_w[0] =
                       (pTVar14->_bag).super__Base_bitset<2UL>._M_w[0];
                  rootSchemaBitset.super__Base_bitset<2UL>._M_w[1] =
                       (pTVar14->_bag).super__Base_bitset<2UL>._M_w[1];
                  lVar18 = 0;
                  for (uVar16 = 0; uVar17 = pTVar14->_numOfNeighbors, uVar16 < uVar17;
                      uVar16 = uVar16 + 1) {
                    neighborSchema(this,(this->_relations).
                                        super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start
                                        [(pTVar14->_neighbors).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar16]],
                                   pTVar14->_id,
                                   (var_bitset *)
                                   ((long)(pTVar14->_neighborSchema->super__Base_bitset<2UL>)._M_w +
                                   lVar18));
                    std::_Base_bitset<2UL>::_M_do_or
                              (&rootSchemaBitset.super__Base_bitset<2UL>,
                               (_Base_bitset<2UL> *)
                               ((long)(this->_root->_neighborSchema->super__Base_bitset<2UL>)._M_w +
                               lVar18));
                    pTVar14 = this->_root;
                    lVar18 = lVar18 + 0x10;
                  }
                  lVar18 = 0;
                  for (uVar16 = 0; uVar16 < uVar17; uVar16 = uVar16 + 1) {
                    sVar19 = pTVar14->_id;
                    node = (this->_relations).
                           super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [(pTVar14->_neighbors).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar16]];
                    local_510._M_w =
                         (_WordT  [2])
                         std::bitset<100UL>::operator~
                                   ((bitset<100UL> *)
                                    ((long)(pTVar14->_neighborSchema->super__Base_bitset<2UL>)._M_w
                                    + lVar18));
                    local_500._0_16_ = std::operator&(&rootSchemaBitset,(bitset<100UL> *)&local_510)
                    ;
                    schema = std::operator|((bitset<100UL> *)&local_500,&this->_root->_bag);
                    parentNeighborSchema
                              (this,node,sVar19,(var_bitset)schema.super__Base_bitset<2UL>._M_w);
                    pTVar14 = this->_root;
                    uVar17 = pTVar14->_numOfNeighbors;
                    lVar18 = lVar18 + 0x10;
                  }
                  std::__cxx11::string::~string((string *)&node2);
                  std::__cxx11::string::~string((string *)&node1);
                  std::__cxx11::string::~string((string *)&eString);
                  std::__cxx11::string::~string((string *)&mString);
                  std::__cxx11::string::~string((string *)&nString);
                  std::__cxx11::string::~string((string *)&index);
                  std::__cxx11::string::~string((string *)&attrs);
                  std::__cxx11::string::~string((string *)&type);
                  std::__cxx11::string::~string((string *)&name);
                  std::__cxx11::string::~string((string *)&attribute);
                  std::__cxx11::stringstream::~stringstream((stringstream *)&ssLine);
                  std::__cxx11::string::~string((string *)&line);
                  std::ifstream::~ifstream(&input);
                  return;
                }
                pTVar14 = ppTVar2[uVar16];
                puVar3 = (pTVar14->_neighbors).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                puVar4 = *(pointer *)
                          ((long)&(pTVar14->_neighbors).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl + 8);
                lVar18 = (long)puVar4 - (long)puVar3;
                uVar15 = lVar18 >> 3;
                pTVar14->_numOfNeighbors = uVar15;
                uVar17 = lVar18 * 2;
                __s = (bitset<100UL> *)operator_new__(-(ulong)(uVar15 >> 0x3c != 0) | uVar17);
                if (puVar4 != puVar3) {
                  memset(__s,0,uVar17 & 0xfffffffffffffff0);
                }
                ppTVar2[uVar16]->_neighborSchema = __s;
                if ((ppTVar2[uVar16]->_numOfNeighbors == 1) || (this->_numOfRelations == 1)) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            (&this->_leafNodes,&ppTVar2[uVar16]->_id);
                }
                do {
                  do {
                    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                       ((istream *)&input,(string *)&line);
                    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0)
                    goto LAB_001e022a;
                  } while (*line._M_dataplus._M_p == '#');
                  bVar6 = std::operator==(&line,"");
                } while (bVar6);
LAB_001e022a:
                std::operator<<(local_3f0,(string *)&line);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&ssLine,(string *)&name,' ');
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&ssLine,(string *)&attrs,' ');
                pmVar13 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)this_02,&name);
                mVar1 = *pmVar13;
                uVar8 = std::__cxx11::stoi(&attrs,(size_t *)0x0,10);
                if ((int)mVar1 == -1) {
                  std::operator+(&local_500,"The relation ",&name);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&rootSchemaBitset,&local_500," was not found\n");
                  std::operator<<((ostream *)&std::cerr,(string *)&rootSchemaBitset);
                  std::__cxx11::string::~string((string *)&rootSchemaBitset);
                  std::__cxx11::string::~string((string *)&local_500);
                }
                if (1 < uVar8) {
                  (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[(int)mVar1]->_threads = (long)(int)uVar8;
                }
                std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
                uVar16 = uVar16 + 1;
              } while( true );
            }
            do {
              do {
                piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)&input,(string *)&line);
                if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0)
                goto LAB_001e004f;
              } while (*line._M_dataplus._M_p == '#');
              bVar6 = std::operator==(&line,"");
            } while (bVar6);
LAB_001e004f:
            std::operator<<(local_3f0,(string *)&line);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&ssLine,(string *)&node1,'-');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&ssLine,(string *)&node2,' ');
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_02,&node1);
            mVar1 = *pmVar13;
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_02,&node2);
            mVar5 = *pmVar13;
            rootSchemaBitset.super__Base_bitset<2UL>._M_w[0] = (long)(int)mVar5;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&(this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[(int)mVar1]->_neighbors,
                       (unsigned_long *)&rootSchemaBitset);
            rootSchemaBitset.super__Base_bitset<2UL>._M_w[0] = (long)(int)mVar1;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&(this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[(int)mVar5]->_neighbors,
                       (unsigned_long *)&rootSchemaBitset);
            std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
            uVar10 = uVar10 + 1;
          } while( true );
        }
        do {
          do {
            piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&input,(string *)&line);
            if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0)
            goto LAB_001dfe52;
          } while (*line._M_dataplus._M_p == '#');
          bVar6 = std::operator==(&line,"");
        } while (bVar6);
LAB_001dfe52:
        std::operator<<(local_3f0,(string *)&line);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&ssLine,(string *)&index,' ');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&ssLine,(string *)&name,':');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&ssLine,(string *)&attrs,' ');
        uVar10 = std::__cxx11::stoul(&index,(size_t *)0x0,10);
        if (sVar19 != uVar10) {
          std::operator<<((ostream *)&std::cerr,
                          "Inconsistent index specified in your DTree config file.\n");
        }
        pTVar14 = (TDNode *)operator_new(0x70);
        std::__cxx11::string::string((string *)&local_278,(string *)&name);
        TDNode::TDNode(pTVar14,&local_278,sVar19);
        (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar19] = pTVar14;
        std::__cxx11::string::~string((string *)&local_278);
        pmVar13 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_02,&name);
        *pmVar13 = sVar19;
        std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
        std::operator<<(local_3f0,(string *)&attrs);
        while( true ) {
          piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&ssLine,(string *)&attribute,',');
          if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
          pTVar14 = (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[sVar19];
          pmVar13 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->_attributeMap,&attribute);
          std::bitset<100UL>::set(&pTVar14->_bag,*pmVar13,true);
        }
        std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
        sVar19 = sVar19 + 1;
      } while( true );
    }
    do {
      do {
        piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&input,(string *)&line);
        if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) goto LAB_001dfc89;
      } while (*line._M_dataplus._M_p == '#');
      bVar6 = std::operator==(&line,"");
    } while (bVar6);
LAB_001dfc89:
    std::operator<<(local_3f0,(string *)&line);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ssLine,(string *)&index,' ');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ssLine,(string *)&name,' ');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ssLine,(string *)&type,' ');
    std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
    uVar12 = std::__cxx11::stoul(&index,(size_t *)0x0,10);
    if (uVar20 != uVar12) {
      std::operator<<((ostream *)&std::cerr,
                      "Inconsistent index specified in your DTree config file.\n");
    }
    iVar7 = std::__cxx11::string::compare((char *)&type);
    t = (Type)(iVar7 == 0);
    iVar7 = std::__cxx11::string::compare((char *)&type);
    if (iVar7 == 0) {
      t = Short;
    }
    iVar7 = std::__cxx11::string::compare((char *)&type);
    if (iVar7 == 0) {
      t = U_Integer;
    }
    this_01 = (Attribute *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_258,(string *)&name);
    Attribute::Attribute(this_01,&local_258,(int)uVar20,t);
    (this->_attributes).super__Vector_base<Attribute_*,_std::allocator<Attribute_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar20] = this_01;
    std::__cxx11::string::~string((string *)&local_258);
    pmVar13 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->_attributeMap,&name);
    *pmVar13 = uVar20;
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

void TreeDecomposition::buildFromFile()
{
    /* Load the TreeDecomposition config file into an input stream. */
    std::ifstream input(multifaq::config::TREEDECOMP_CONF);

    if (!input)
    {
        ERROR(multifaq::config::TREEDECOMP_CONF+" does not exist. \n");
        exit(1);
    }

    DINFO("Building the TD from file: " << multifaq::config::TREEDECOMP_CONF << " ... ");
   
    /* Number of attributes and tables. */
    size_t n, m, e;

    /* String and associated stream to receive lines from the file. */
    std::string line;
    std::stringstream ssLine;

    /* String to receive the attributes from the relation. */
    std::string attribute;

    /* Read all the attributes - name and value - and parent and key. */
    std::string name;
    std::string type;
    std::string attrs;
    std::string index;
    
    /* Skmaip any comments at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;
    
        break;
    }

    /* Extract number of attributes and tables. */
    ssLine << line;

    std::string nString, mString, eString;
    getline(ssLine, nString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, mString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, eString, PARAMETER_SEPARATOR_CHAR);
   
    ssLine.clear();

    /* Convert the strings to integers. */
    n = stoul(nString);
    m = stoul(mString);
    e = stoul(eString);

    /* Set numOfAttributes and _numOfRelations. */
    this->_numOfAttributes = n;
    this->_numOfRelations = m;
    this->_numOfEdges = e;

    this->_relations.resize(m);
    // this->_attributesInRelation.resize(m);
    this->_attributes.resize(n);
   
    for (size_t i = 0; i < n; ++i)
    {
        /* Extract node information for each attribute. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        /* Get the six parameters specified for each attribute. */
        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, type, PARAMETER_SEPARATOR_CHAR);

        /* Clear string stream. */
        ssLine.clear();

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

        Type t = Type::Integer;        
        if (type.compare("double")==0) t = Type::Double;
        if (type.compare("short")==0) t = Type::Short;
        if (type.compare("uint")==0) t = Type::U_Integer;
        
        this->_attributes[i] = new Attribute(name, i, t);
        this->_attributeMap[name] = i;
    }
  
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < m; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        /* Get the three parameters specified for each relation. */
        // getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        // getline(ssLine, parent, PARAMETER_SEPARATOR_CHAR);

        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, NAME_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

#ifdef PRINT_TD
        DINFO( index << " " << name << " " << attrs << "\n");
#endif
        this->_relations[i] = new TDNode(name, i);
        this->_relationsMap[name] = i;

        /* Clear string stream. */
        ssLine.clear();

        ssLine << attrs;

        while (getline(ssLine, attribute, ATTRIBUTE_SEPARATOR_CHAR))
            this->_relations[i]->_bag.set(_attributeMap[attribute]);
        
        /* Clear string stream. */
        ssLine.clear();
    }

    std::string node1, node2;
    
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < e; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        getline(ssLine, node1, EDGE_SEPARATOR_CHAR);
        getline(ssLine, node2, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD
        DINFO( node1 << " - " << node2 << "\n");
#endif

        int n1 = _relationsMap[node1];
        int n2 = _relationsMap[node2];

        _relations[n1]->_neighbors.push_back(n2);
        _relations[n2]->_neighbors.push_back(n1);

        ssLine.clear();
    }
    
    for (size_t i = 0; i < _numOfRelations; i++)
    {
        _relations[i]->_numOfNeighbors = _relations[i]->_neighbors.size();
        _relations[i]->_neighborSchema = new var_bitset[_relations[i]->_numOfNeighbors];
        
        if (_relations[i]->_numOfNeighbors == 1 || _numOfRelations == 1)
            _leafNodes.push_back(_relations[i]->_id);


        /* Extract node information for each relation. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD        
        DINFO( name << " - " << attrs << "\n");
#endif
        int relID = _relationsMap[name];
        size_t threads = std::stoi(attrs);

        if (relID == -1)
            ERROR("The relation "+name+" was not found\n");
        
        if (threads > 1)
        {
            this->_relations[relID]->_threads = threads;
        }
        
        ssLine.clear();
    }
    
    // We are computing the schema!    
    this->_root = _relations[0];
    var_bitset rootSchemaBitset = _root->_bag;
    
    /* Setting neighborSchema for root node! */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        neighborSchema(getRelation(_root->_neighbors[n]), _root->_id,
                       _root->_neighborSchema[n]);

        rootSchemaBitset |= _root->_neighborSchema[n];
    }

    /* Propagating schema down */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        parentNeighborSchema(
            getRelation(_root->_neighbors[n]), _root->_id,
            (rootSchemaBitset & ~_root->_neighborSchema[n]) | _root->_bag);
    }
 
    // for (size_t i = 0; i < _numOfRelations; i++)
    // {
    //     printf("node: %s : ", getRelation(i)->_name.c_str());
    //     std::cout << getRelation(i)->_bag << "\n";
    //     for (size_t c = 0; c < getRelation(i)->_numOfNeighbors; c++)
    //         std::cout <<getRelation(i)->_neighborSchema[c] << " | ";
    //     std::cout << "\n";
    // }
}